

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_firstIndexOf
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  InstanceIsEqualToComparator *this_00;
  pointer lhs;
  long lVar3;
  shared_ptr<Instance> instance;
  IntegerInstance local_88;
  
  this_00 = (InstanceIsEqualToComparator *)&instance;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x20) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  get_shared_instance((string *)&instance,&this->_element_type);
  lhs = (this->_value).
        super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  lVar3 = -(long)lhs;
  do {
    if (lhs == (this->_value).
               super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"-1",(allocator *)&local_88);
LAB_00155d4b:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return __return_storage_ptr__;
    }
    bVar1 = InstanceIsEqualToComparator::operator()(this_00,lhs,&instance);
    if (bVar1) {
      IntegerInstance::IntegerInstance
                (&local_88,
                 (int)((ulong)-((long)&(((this->_value).
                                         super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                                       _M_ptr + lVar3) >> 4));
      std::__cxx11::to_string(__return_storage_ptr__,local_88._value);
      CharacterInstance::~CharacterInstance((CharacterInstance *)&local_88);
      goto LAB_00155d4b;
    }
    lhs = lhs + 1;
    lVar3 = lVar3 + -0x10;
  } while( true );
}

Assistant:

std::string VectorInstance::op_firstIndexOf(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    for (auto it = _value.begin(); it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance))
            return IntegerInstance(it - _value.begin()).representation();
    return "-1";
}